

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConcaveCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btConvexConcaveCollisionAlgorithm::processCollision
          (btConvexConcaveCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  btPersistentManifold *this_00;
  bool bVar1;
  btCollisionShape *pbVar2;
  btCollisionObject *body0;
  btCollisionObject *body1;
  btCollisionObjectWrapper **ppbVar3;
  btVector3 *pbVar4;
  btVector3 *pbVar5;
  btCollisionObjectWrapper *in_RDX;
  btCollisionObjectWrapper *in_RSI;
  btManifoldResult *in_RDI;
  btManifoldResult *in_R8;
  btScalar collisionMarginTriangle;
  btConcaveShape *concaveShape;
  btCollisionObjectWrapper *triBodyWrap;
  btCollisionObjectWrapper *convexBodyWrap;
  btCollisionObjectWrapper *local_60;
  btCollisionObjectWrapper *local_58;
  
  local_58 = in_RSI;
  if (((ulong)in_RDI->m_body0Wrap & 1) != 0) {
    local_58 = in_RDX;
  }
  local_60 = in_RDX;
  if (((ulong)in_RDI->m_body0Wrap & 1) != 0) {
    local_60 = in_RSI;
  }
  btCollisionObjectWrapper::getCollisionShape(local_60);
  bVar1 = btCollisionShape::isConcave((btCollisionShape *)0x192e73);
  if (bVar1) {
    pbVar2 = btCollisionObjectWrapper::getCollisionShape(local_60);
    btCollisionObjectWrapper::getCollisionShape(local_58);
    bVar1 = btCollisionShape::isConvex((btCollisionShape *)0x192e9d);
    if (bVar1) {
      (*pbVar2->_vptr_btCollisionShape[0xc])();
      btManifoldResult::setPersistentManifold(in_R8,(btPersistentManifold *)in_RDI[2].m_body0Wrap);
      btConvexTriangleCallback::setTimeStepAndCounters
                ((btConvexTriangleCallback *)this,body0Wrap._4_4_,(btDispatcherInfo *)body1Wrap,
                 (btCollisionObjectWrapper *)dispatchInfo,(btCollisionObjectWrapper *)resultOut,
                 (btManifoldResult *)convexBodyWrap);
      this_00 = (btPersistentManifold *)in_RDI[2].m_body0Wrap;
      body0 = btCollisionObjectWrapper::getCollisionObject(local_58);
      body1 = btCollisionObjectWrapper::getCollisionObject(local_60);
      btPersistentManifold::setBodies(this_00,body0,body1);
      ppbVar3 = &in_RDI->m_body1Wrap;
      pbVar4 = btConvexTriangleCallback::getAabbMin
                         ((btConvexTriangleCallback *)&in_RDI->m_body1Wrap);
      pbVar5 = btConvexTriangleCallback::getAabbMax
                         ((btConvexTriangleCallback *)&in_RDI->m_body1Wrap);
      (*pbVar2->_vptr_btCollisionShape[0x10])(pbVar2,ppbVar3,pbVar4,pbVar5);
      btManifoldResult::refreshContactPoints(in_RDI);
      btConvexTriangleCallback::clearWrapperData((btConvexTriangleCallback *)&in_RDI->m_body1Wrap);
    }
  }
  return;
}

Assistant:

void btConvexConcaveCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	
	
	const btCollisionObjectWrapper* convexBodyWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const btCollisionObjectWrapper* triBodyWrap = m_isSwapped ? body0Wrap : body1Wrap;

	if (triBodyWrap->getCollisionShape()->isConcave())
	{


		
		const btConcaveShape* concaveShape = static_cast<const btConcaveShape*>( triBodyWrap->getCollisionShape());
		
		if (convexBodyWrap->getCollisionShape()->isConvex())
		{
			btScalar collisionMarginTriangle = concaveShape->getMargin();
					
			resultOut->setPersistentManifold(m_btConvexTriangleCallback.m_manifoldPtr);
			m_btConvexTriangleCallback.setTimeStepAndCounters(collisionMarginTriangle,dispatchInfo,convexBodyWrap,triBodyWrap,resultOut);

			m_btConvexTriangleCallback.m_manifoldPtr->setBodies(convexBodyWrap->getCollisionObject(),triBodyWrap->getCollisionObject());

			concaveShape->processAllTriangles( &m_btConvexTriangleCallback,m_btConvexTriangleCallback.getAabbMin(),m_btConvexTriangleCallback.getAabbMax());
			
			resultOut->refreshContactPoints();

			m_btConvexTriangleCallback.clearWrapperData();
	
		}
	
	}

}